

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixin_inheritance.cpp
# Opt level: O2

string * __thiscall
TransparentShape<ColoredShape<Circle>>::str_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  ColoredShape<Circle>::str_abi_cxx11_(&local_38,(ColoredShape<Circle> *)this);
  std::operator+(&local_78,&local_38," with transparency ");
  std::__cxx11::to_string(&sStack_98,((float)*(byte *)((long)this + 0x10) / 255.0) * 100.0);
  std::operator+(&local_58,&local_78,&sStack_98);
  std::operator+(__return_storage_ptr__,&local_58,'%');
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const override
	{
		return T::str() + " with transparency " + std::to_string(transparency / 255.0f * 100) + '%';
	}